

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_export_ostream.cpp
# Opt level: O0

int UnsignedLongLong_Unsigned_Test::AddToRegistry(void)

{
  UnitTest *this;
  ParameterizedTestSuiteRegistry *this_00;
  ParameterizedTestSuiteInfo<UnsignedLongLong> *this_01;
  TestMetaFactoryBase<unsigned_long_long> *meta_factory;
  allocator local_b1;
  string local_b0;
  CodeLocation local_90;
  allocator local_51;
  string local_50;
  CodeLocation local_30;
  
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::parameterized_test_registry(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_ostream.cpp"
             ,&local_51);
  testing::internal::CodeLocation::CodeLocation(&local_30,&local_50,0x150);
  this_01 = testing::internal::ParameterizedTestSuiteRegistry::
            GetTestSuitePatternHolder<UnsignedLongLong>(this_00,"UnsignedLongLong",&local_30);
  meta_factory = (TestMetaFactoryBase<unsigned_long_long> *)operator_new(8);
  testing::internal::TestMetaFactory<UnsignedLongLong_Unsigned_Test>::TestMetaFactory
            ((TestMetaFactory<UnsignedLongLong_Unsigned_Test> *)meta_factory);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_ostream.cpp"
             ,&local_b1);
  testing::internal::CodeLocation::CodeLocation(&local_90,&local_b0,0x150);
  testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::AddTestPattern
            (this_01,"UnsignedLongLong","Unsigned",meta_factory,&local_90);
  testing::internal::CodeLocation::~CodeLocation(&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  testing::internal::CodeLocation::~CodeLocation(&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return 0;
}

Assistant:

TEST_P (UnsignedLongLong, Unsigned) {
    SCOPED_TRACE ("UnsignedLongLong");
    check (GetParam ());
}